

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_4::PtexUtils::reduceTri
               (void *src,int sstride,int w,int param_4,void *dst,int dstride,DataType dt,int nchan)

{
  void *pvVar1;
  uint16_t uVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  void *local_90;
  
  local_90 = dst;
  switch(dt) {
  case dt_uint8:
    iVar11 = w * sstride;
    if (iVar11 != 0) {
      iVar7 = nchan * w;
      lVar5 = (long)nchan;
      pvVar4 = (void *)((long)iVar11 + (long)src);
      lVar10 = (long)src + (((long)iVar7 + (long)((w + -1) * sstride)) - lVar5);
      do {
        pvVar6 = src;
        if (iVar7 != 0) {
          pvVar6 = (void *)((long)src + (long)iVar7);
          do {
            if (nchan != 0) {
              lVar8 = 0;
              do {
                *(char *)((long)local_90 + lVar8) =
                     (char)((uint)*(byte *)(lVar10 + lVar8) +
                            (uint)*(byte *)((long)src + lVar8 + sstride) +
                            (uint)*(byte *)((long)src + lVar5 + lVar8) +
                            (uint)*(byte *)((long)src + lVar8) >> 2);
                lVar8 = lVar8 + 1;
              } while (lVar8 != lVar5);
              local_90 = (void *)((long)local_90 + lVar8);
              lVar10 = lVar10 + lVar8;
              src = (void *)((long)src + lVar5);
            }
            lVar10 = lVar10 + -(nchan + sstride * 2);
            src = (void *)((long)src + lVar5);
          } while (src != pvVar6);
        }
        local_90 = (void *)((long)local_90 + (long)(dstride - iVar7 / 2));
        lVar10 = lVar10 + (iVar11 + nchan * -2);
        src = (void *)((long)pvVar6 + (long)(sstride * 2 - iVar7));
      } while (src != pvVar4);
    }
    break;
  case dt_uint16:
    iVar7 = sstride / 2;
    iVar11 = iVar7 * w;
    if (iVar11 != 0) {
      iVar9 = nchan * w;
      lVar5 = (long)nchan;
      pvVar4 = (void *)((long)src + (long)iVar11 * 2);
      lVar10 = (long)src + lVar5 * -2 + (long)iVar9 * 2 + (long)((w + -1) * iVar7) * 2;
      do {
        pvVar6 = src;
        if (iVar9 != 0) {
          pvVar6 = (void *)((long)src + (long)iVar9 * 2);
          do {
            if (nchan != 0) {
              pvVar1 = (void *)((long)src + lVar5 * 2);
              lVar8 = 0;
              do {
                *(short *)((long)local_90 + lVar8) =
                     (short)((uint)*(ushort *)(lVar10 + lVar8) +
                             (uint)*(ushort *)((long)src + lVar8 + (long)iVar7 * 2) +
                             (uint)*(ushort *)((long)pvVar1 + lVar8) +
                             (uint)*(ushort *)((long)src + lVar8) >> 2);
                lVar8 = lVar8 + 2;
              } while (lVar8 != lVar5 * 2);
              local_90 = (void *)((long)local_90 + lVar8);
              lVar10 = lVar10 + lVar8;
              src = pvVar1;
            }
            src = (void *)(lVar5 * 2 + (long)src);
            lVar10 = lVar10 + (long)-(nchan + iVar7 * 2) * 2;
          } while (src != pvVar6);
        }
        src = (void *)((long)pvVar6 + (long)(iVar7 * 2 - iVar9) * 2);
        lVar10 = lVar10 + (long)(iVar11 + nchan * -2) * 2;
        local_90 = (void *)((long)local_90 + (long)(dstride / 2 - iVar9 / 2) * 2);
      } while (src != pvVar4);
    }
    break;
  case dt_half:
    iVar11 = sstride / 2;
    iVar7 = iVar11 * w;
    if (iVar7 != 0) {
      iVar9 = nchan * w;
      lVar5 = (long)nchan;
      pvVar4 = (void *)((long)src + (long)iVar7 * 2);
      lVar10 = (long)src + lVar5 * -2 + (long)iVar9 * 2 + (long)((w + -1) * iVar11) * 2;
      do {
        pvVar6 = src;
        if (iVar9 != 0) {
          pvVar6 = (void *)((long)src + (long)iVar9 * 2);
          do {
            if (nchan != 0) {
              pvVar1 = (void *)((long)src + lVar5 * 2);
              lVar8 = 0;
              do {
                uVar2 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable +
                                                       (ulong)*(ushort *)((long)src + lVar8) * 4) +
                                             *(float *)(PtexHalf::h2fTable +
                                                       (ulong)*(ushort *)((long)pvVar1 + lVar8) * 4)
                                             + *(float *)(PtexHalf::h2fTable +
                                                         (ulong)*(ushort *)
                                                                 ((long)src +
                                                                 lVar8 + (long)iVar11 * 2) * 4) +
                                            *(float *)(PtexHalf::h2fTable +
                                                      (ulong)*(ushort *)(lVar10 + lVar8) * 4)) *
                                            0.25);
                *(uint16_t *)((long)local_90 + lVar8) = uVar2;
                lVar8 = lVar8 + 2;
              } while (lVar8 != lVar5 * 2);
              local_90 = (void *)((long)local_90 + lVar8);
              lVar10 = lVar10 + lVar8;
              src = pvVar1;
            }
            src = (void *)((long)src + lVar5 * 2);
            lVar10 = lVar10 + (long)-(nchan + iVar11 * 2) * 2;
          } while (src != pvVar6);
        }
        src = (void *)((long)pvVar6 + (long)(iVar11 * 2 - iVar9) * 2);
        lVar10 = lVar10 + (long)(iVar7 + nchan * -2) * 2;
        local_90 = (void *)((long)local_90 + (long)(dstride / 2 - iVar9 / 2) * 2);
      } while (src != pvVar4);
    }
    break;
  case dt_float:
    iVar11 = sstride + 3;
    if (-1 < sstride) {
      iVar11 = sstride;
    }
    iVar11 = iVar11 >> 2;
    iVar7 = iVar11 * w;
    if (iVar7 != 0) {
      iVar3 = nchan * w;
      lVar10 = (long)nchan;
      iVar9 = dstride + 3;
      if (-1 < dstride) {
        iVar9 = dstride;
      }
      pvVar4 = (void *)((long)src + (long)iVar7 * 4);
      lVar5 = (long)src + lVar10 * -4 + (long)iVar3 * 4 + (long)((w + -1) * iVar11) * 4;
      do {
        pvVar6 = src;
        if (iVar3 != 0) {
          pvVar6 = (void *)((long)src + (long)iVar3 * 4);
          do {
            if (nchan != 0) {
              pvVar1 = (void *)((long)src + lVar10 * 4);
              lVar8 = 0;
              do {
                *(float *)((long)local_90 + lVar8) =
                     (*(float *)((long)src + lVar8) + *(float *)((long)pvVar1 + lVar8) +
                      *(float *)((long)src + lVar8 + (long)iVar11 * 4) + *(float *)(lVar5 + lVar8))
                     * 0.25;
                lVar8 = lVar8 + 4;
              } while (lVar8 != lVar10 * 4);
              local_90 = (void *)((long)local_90 + lVar8);
              lVar5 = lVar5 + lVar8;
              src = pvVar1;
            }
            src = (void *)((long)src + lVar10 * 4);
            lVar5 = lVar5 + (long)-(nchan + iVar11 * 2) * 4;
          } while (src != pvVar6);
        }
        src = (void *)((long)pvVar6 + (long)(iVar11 * 2 - iVar3) * 4);
        lVar5 = lVar5 + (long)(iVar7 + nchan * -2) * 4;
        local_90 = (void *)((long)local_90 + (long)((iVar9 >> 2) - iVar3 / 2) * 4);
      } while (src != pvVar4);
    }
  }
  return;
}

Assistant:

void reduceTri(const void* src, int sstride, int w, int /*vw*/,
               void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduceTri(static_cast<const uint8_t*>(src), sstride, w, 0,
                                 static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduceTri(static_cast<const PtexHalf*>(src), sstride, w, 0,
                                 static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduceTri(static_cast<const uint16_t*>(src), sstride, w, 0,
                                 static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduceTri(static_cast<const float*>(src), sstride, w, 0,
                                 static_cast<float*>(dst), dstride, nchan); break;
    }
}